

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PulseQueuedTape.cpp
# Opt level: O2

Pulse __thiscall Storage::Tape::PulseQueuedTape::virtual_get_next_pulse(PulseQueuedTape *this)

{
  pointer pPVar1;
  long lVar2;
  pointer pPVar3;
  undefined8 uVar4;
  uint uVar5;
  size_t sVar6;
  Pulse PVar7;
  
  uVar4 = 0x100000002;
  uVar5 = 1;
  if (this->is_at_end_ != false) goto LAB_003f154a;
  sVar6 = this->pulse_pointer_;
  pPVar3 = (this->queued_pulses_).
           super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->queued_pulses_).
           super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = (long)pPVar1 - (long)pPVar3;
  if (sVar6 == lVar2 / 0xc) {
    if (pPVar1 != pPVar3) {
      (this->queued_pulses_).
      super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>.
      _M_impl.super__Vector_impl_data._M_finish = pPVar3;
    }
    this->pulse_pointer_ = 0;
    (*(this->super_Tape)._vptr_Tape[9])(this,sVar6,lVar2 % 0xc);
    if (this->is_at_end_ != false) goto LAB_003f154a;
    sVar6 = this->pulse_pointer_;
    pPVar3 = (this->queued_pulses_).
             super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (sVar6 == ((long)(this->queued_pulses_).
                        super__Vector_base<Storage::Tape::Tape::Pulse,_std::allocator<Storage::Tape::Tape::Pulse>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0xc)
    goto LAB_003f154a;
  }
  this->pulse_pointer_ = sVar6 + 1;
  uVar4._0_4_ = pPVar3[sVar6].type;
  uVar4._4_4_ = pPVar3[sVar6].length.length;
  uVar5 = pPVar3[sVar6].length.clock_rate;
LAB_003f154a:
  PVar7.length.clock_rate = uVar5;
  PVar7.type = (int)uVar4;
  PVar7.length.length = (int)((ulong)uVar4 >> 0x20);
  return PVar7;
}

Assistant:

Tape::Pulse PulseQueuedTape::virtual_get_next_pulse() {
	if(is_at_end_) {
		return silence();
	}

	if(pulse_pointer_ == queued_pulses_.size()) {
		clear();
		get_next_pulses();

		if(is_at_end_ || pulse_pointer_ == queued_pulses_.size()) {
			return silence();
		}
	}

	std::size_t read_pointer = pulse_pointer_;
	pulse_pointer_++;
	return queued_pulses_[read_pointer];
}